

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O0

uint32 __thiscall
Clasp::Asp::LogicProgram::update(LogicProgram *this,PrgBody *body,uint32 oldHash,uint32 newHash)

{
  bool bVar1;
  PrgNode *in_RSI;
  long in_RDI;
  LogicProgram *unaff_retaddr;
  uint32 eqId;
  uint32 id;
  uint32 in_stack_0000014c;
  PrgBody *in_stack_00000150;
  LogicProgram *in_stack_00000158;
  unordered_multimap<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_00;
  pair<const_unsigned_int,_unsigned_int> local_30;
  uint32 local_28;
  uint32 local_24;
  uint local_20 [2];
  PrgNode *local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_18 = in_RSI;
  local_24 = removeBody(unaff_retaddr,
                        (PrgBody *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (uint32)((ulong)in_RDI >> 0x20));
  bVar1 = PrgNode::relevant(local_18);
  if (bVar1) {
    local_28 = findEqBody(in_stack_00000158,in_stack_00000150,in_stack_0000014c);
    if (local_28 == 0x40000000) {
      this_00 = *(unordered_multimap<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  **)(in_RDI + 0xa8);
      std::pair<const_unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
                (&local_30,local_20,&local_24);
      std::
      unordered_multimap<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::insert(this_00,(value_type *)0x1843d5);
    }
  }
  else {
    local_28 = 0x40000000;
  }
  return local_28;
}

Assistant:

uint32 LogicProgram::update(PrgBody* body, uint32 oldHash, uint32 newHash) {
	uint32 id   = removeBody(body, oldHash);
	if (body->relevant()) {
		uint32 eqId = findEqBody(body, newHash);
		if (eqId == varMax) {
			// No equivalent body found.
			// Add new entry to index
			index_->body.insert(IndexMap::value_type(newHash, id));
		}
		return eqId;
	}
	return varMax;
}